

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereLoopOutputAdjust(WhereClause *pWC,WhereLoop *pLoop,LogEst nRow)

{
  short sVar1;
  int iVar2;
  int local_54;
  Expr *pEStack_50;
  int k;
  Expr *pRight;
  uint local_40;
  int iStack_3c;
  LogEst iReduce;
  int j;
  int i;
  Bitmask notAllowed;
  WhereTerm *pX;
  WhereTerm *pTerm;
  WhereLoop *pWStack_18;
  LogEst nRow_local;
  WhereLoop *pLoop_local;
  WhereClause *pWC_local;
  
  _j = (pLoop->prereq | pLoop->maskSelf) ^ 0xffffffffffffffff;
  pRight._6_2_ = 0;
  iStack_3c = pWC->nBase;
  pX = pWC->a;
  pTerm._6_2_ = nRow;
  pWStack_18 = pLoop;
  pLoop_local = (WhereLoop *)pWC;
  do {
    if (iStack_3c < 1) {
      if ((int)pTerm._6_2_ - (int)pRight._6_2_ < (int)pWStack_18->nOut) {
        pWStack_18->nOut = pTerm._6_2_ - pRight._6_2_;
      }
      return;
    }
    if ((((pX->prereqAll & _j) == 0) && ((pX->prereqAll & pWStack_18->maskSelf) != 0)) &&
       ((pX->wtFlags & 2) == 0)) {
      local_40 = (uint)pWStack_18->nLTerm;
      while (local_40 = local_40 - 1, -1 < (int)local_40) {
        notAllowed = (Bitmask)pWStack_18->aLTerm[(int)local_40];
        if (((WhereTerm *)notAllowed != (WhereTerm *)0x0) &&
           (((WhereTerm *)notAllowed == pX ||
            ((-1 < ((WhereTerm *)notAllowed)->iParent &&
             ((WhereTerm *)
              (&((pLoop_local->u).btree.pIndex)->zName +
              (long)((WhereTerm *)notAllowed)->iParent * 7) == pX)))))) break;
      }
      if ((int)local_40 < 0) {
        if ((pWStack_18->maskSelf == pX->prereqAll) &&
           (((pX->eOperator & 0x3f) != 0 ||
            ((*(byte *)(*(long *)(pLoop_local->prereq + 8) + (ulong)pWStack_18->iTab * 0x68 + 0x44)
             & 0x48) == 0)))) {
          pWStack_18->wsFlags = pWStack_18->wsFlags | 0x800000;
        }
        if (pX->truthProb < 1) {
          pWStack_18->nOut = pWStack_18->nOut + pX->truthProb;
        }
        else {
          pWStack_18->nOut = pWStack_18->nOut + -1;
          if ((pX->eOperator & 0x82) != 0) {
            pEStack_50 = pX->pExpr->pRight;
            local_54 = 0;
            iVar2 = sqlite3ExprIsInteger(pEStack_50,&local_54);
            if (((iVar2 == 0) || (local_54 < -1)) || (1 < local_54)) {
              sVar1 = 0x14;
            }
            else {
              sVar1 = 10;
            }
            if (pRight._6_2_ < sVar1) {
              pX->wtFlags = pX->wtFlags | 0x2000;
              pRight._6_2_ = sVar1;
            }
          }
        }
      }
    }
    iStack_3c = iStack_3c + -1;
    pX = pX + 1;
  } while( true );
}

Assistant:

static void whereLoopOutputAdjust(
  WhereClause *pWC,      /* The WHERE clause */
  WhereLoop *pLoop,      /* The loop to adjust downward */
  LogEst nRow            /* Number of rows in the entire table */
){
  WhereTerm *pTerm, *pX;
  Bitmask notAllowed = ~(pLoop->prereq|pLoop->maskSelf);
  int i, j;
  LogEst iReduce = 0;    /* pLoop->nOut should not exceed nRow-iReduce */

  assert( (pLoop->wsFlags & WHERE_AUTO_INDEX)==0 );
  for(i=pWC->nBase, pTerm=pWC->a; i>0; i--, pTerm++){
    assert( pTerm!=0 );
    if( (pTerm->prereqAll & notAllowed)!=0 ) continue;
    if( (pTerm->prereqAll & pLoop->maskSelf)==0 ) continue;
    if( (pTerm->wtFlags & TERM_VIRTUAL)!=0 ) continue;
    for(j=pLoop->nLTerm-1; j>=0; j--){
      pX = pLoop->aLTerm[j];
      if( pX==0 ) continue;
      if( pX==pTerm ) break;
      if( pX->iParent>=0 && (&pWC->a[pX->iParent])==pTerm ) break;
    }
    if( j<0 ){
      if( pLoop->maskSelf==pTerm->prereqAll ){
        /* If there are extra terms in the WHERE clause not used by an index
        ** that depend only on the table being scanned, and that will tend to
        ** cause many rows to be omitted, then mark that table as
        ** "self-culling".
        **
        ** 2022-03-24:  Self-culling only applies if either the extra terms
        ** are straight comparison operators that are non-true with NULL
        ** operand, or if the loop is not an OUTER JOIN.
        */
        if( (pTerm->eOperator & 0x3f)!=0
         || (pWC->pWInfo->pTabList->a[pLoop->iTab].fg.jointype
                  & (JT_LEFT|JT_LTORJ))==0
        ){
          pLoop->wsFlags |= WHERE_SELFCULL;
        }
      }
      if( pTerm->truthProb<=0 ){
        /* If a truth probability is specified using the likelihood() hints,
        ** then use the probability provided by the application. */
        pLoop->nOut += pTerm->truthProb;
      }else{
        /* In the absence of explicit truth probabilities, use heuristics to
        ** guess a reasonable truth probability. */
        pLoop->nOut--;
        if( (pTerm->eOperator&(WO_EQ|WO_IS))!=0
         && (pTerm->wtFlags & TERM_HIGHTRUTH)==0  /* tag-20200224-1 */
        ){
          Expr *pRight = pTerm->pExpr->pRight;
          int k = 0;
          testcase( pTerm->pExpr->op==TK_IS );
          if( sqlite3ExprIsInteger(pRight, &k) && k>=(-1) && k<=1 ){
            k = 10;
          }else{
            k = 20;
          }
          if( iReduce<k ){
            pTerm->wtFlags |= TERM_HEURTRUTH;
            iReduce = k;
          }
        }
      }
    }
  }
  if( pLoop->nOut > nRow-iReduce ){
    pLoop->nOut = nRow - iReduce;
  }
}